

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O0

int ssl_get_ecdh_params_from_cert(mbedtls_ssl_context *ssl)

{
  int iVar1;
  mbedtls_ecp_keypair *key;
  mbedtls_ecp_keypair *peer_key;
  int ret;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->session_negotiate->peer_cert == (mbedtls_x509_crt *)0x0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
               ,0x871,"certificate required");
    ssl_local._4_4_ = -0x7700;
  }
  else {
    iVar1 = mbedtls_pk_can_do(&ssl->session_negotiate->peer_cert->pk,MBEDTLS_PK_ECKEY);
    if (iVar1 == 0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,0x878,"server key not ECDH capable");
      ssl_local._4_4_ = -0x6d00;
    }
    else {
      key = mbedtls_pk_ec(ssl->session_negotiate->peer_cert->pk);
      ssl_local._4_4_ = mbedtls_ecdh_get_params(&ssl->handshake->ecdh_ctx,key,MBEDTLS_ECDH_THEIRS);
      if (ssl_local._4_4_ == 0) {
        iVar1 = ssl_check_server_ecdh_params(ssl);
        if (iVar1 != 0) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x887,"bad server certificate (ECDH curve)");
          ssl_local._4_4_ = -0x7a00;
        }
      }
      else {
        mbedtls_debug_print_ret
                  (ssl,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                   ,0x881,"mbedtls_ecdh_get_params",ssl_local._4_4_);
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_get_ecdh_params_from_cert( mbedtls_ssl_context *ssl )
{
    int ret;

    if( ! mbedtls_pk_can_do( mbedtls_ssl_own_key( ssl ), MBEDTLS_PK_ECKEY ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server key not ECDH capable" ) );
        return( MBEDTLS_ERR_SSL_PK_TYPE_MISMATCH );
    }

    if( ( ret = mbedtls_ecdh_get_params( &ssl->handshake->ecdh_ctx,
                                 mbedtls_pk_ec( *mbedtls_ssl_own_key( ssl ) ),
                                 MBEDTLS_ECDH_OURS ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, ( "mbedtls_ecdh_get_params" ), ret );
        return( ret );
    }

    return( 0 );
}